

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v11::detail::bigint::assign(bigint *this,bigint *other)

{
  ulong uVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar1) {
    (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,uVar1);
    uVar4 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
    (this->bigits_).super_buffer<unsigned_int>.size_ = uVar4;
  }
  else {
    (this->bigits_).super_buffer<unsigned_int>.size_ = uVar1;
    if (uVar1 == 0) goto LAB_00119a37;
  }
  puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
  puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  lVar5 = 0;
  do {
    *(undefined4 *)((long)puVar3 + lVar5) = *(undefined4 *)((long)puVar2 + lVar5);
    lVar5 = lVar5 + 4;
  } while (uVar1 << 2 != lVar5);
LAB_00119a37:
  this->exp_ = other->exp_;
  return;
}

Assistant:

FMT_CONSTEXPR void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    copy<bigit>(data, data + size, bigits_.data());
    exp_ = other.exp_;
  }